

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O0

IFileArchive * __thiscall
irr::io::CArchiveLoaderZIP::createArchive
          (CArchiveLoaderZIP *this,path *filename,bool ignoreCase,bool ignorePaths)

{
  long lVar1;
  byte in_CL;
  byte in_DL;
  undefined8 in_RSI;
  long *in_RDI;
  IReadFile *file;
  IFileArchive *archive;
  IReferenceCounted *in_stack_ffffffffffffffc8;
  IFileArchive *local_20;
  
  local_20 = (IFileArchive *)0x0;
  lVar1 = (*(code *)**(undefined8 **)in_RDI[1])((undefined8 *)in_RDI[1],in_RSI);
  if (lVar1 != 0) {
    local_20 = (IFileArchive *)(**(code **)(*in_RDI + 0x20))(in_RDI,lVar1,in_DL & 1,in_CL & 1);
    IReferenceCounted::drop(in_stack_ffffffffffffffc8);
  }
  return local_20;
}

Assistant:

IFileArchive *CArchiveLoaderZIP::createArchive(const io::path &filename, bool ignoreCase, bool ignorePaths) const
{
	IFileArchive *archive = 0;
	io::IReadFile *file = FileSystem->createAndOpenFile(filename);

	if (file) {
		archive = createArchive(file, ignoreCase, ignorePaths);
		file->drop();
	}

	return archive;
}